

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O3

aiMesh * __thiscall
Assimp::ColladaLoader::CreateMesh
          (ColladaLoader *this,ColladaParser *pParser,Mesh *pSrcMesh,SubMesh *pSubMesh,
          Controller *pSrcController,size_t pStartVertex,size_t pStartFace)

{
  aiVector3D **__s;
  AccessorLibrary *pLibrary;
  DataLibrary *pLibrary_00;
  map<Assimp::BaseImporter::ImporterUnits,_double,_std::less<Assimp::BaseImporter::ImporterUnits>,_std::allocator<std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>_>_>
  *pmVar1;
  _Rb_tree_header *p_Var2;
  pointer *pppaVar3;
  float fVar4;
  float fVar5;
  pointer paVar6;
  Mesh *pSrcMesh_00;
  SubMesh *pSubMesh_00;
  iterator __position;
  aiMesh *mesh;
  pointer pbVar7;
  pointer puVar8;
  unsigned_long uVar9;
  iterator __position_00;
  void *__src;
  bool bVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined8 uVar40;
  undefined1 auVar41 [8];
  int iVar42;
  aiMesh *paVar43;
  size_t sVar44;
  aiVector3D *paVar45;
  long lVar46;
  aiColor4D *__s_00;
  ulong *puVar47;
  aiFace *paVar48;
  uint *puVar49;
  Mesh **ppMVar50;
  Accessor *pAVar51;
  Accessor *pAVar52;
  Data *pDVar53;
  Data *pDVar54;
  pointer pbVar55;
  pointer pfVar56;
  _Rb_tree_node_base *p_Var57;
  aiMesh *paVar58;
  aiAnimMesh **ppaVar59;
  Accessor *pAVar60;
  Data *pData;
  pointer ppVar61;
  aiBone **ppaVar62;
  aiBone *paVar63;
  char *__s_01;
  string *psVar64;
  aiVertexWeight *__s_02;
  Node *pNVar65;
  Logger *this_00;
  runtime_error *prVar66;
  ulong uVar67;
  ulong uVar68;
  aiFace *paVar69;
  long lVar70;
  int iVar71;
  ulong uVar72;
  ulong uVar73;
  size_type __n;
  ColladaLoader *pCVar74;
  size_t *psVar75;
  size_t real;
  size_t sVar76;
  long lVar77;
  aiVertexWeight aVar78;
  Controller *pCVar79;
  unsigned_long uVar80;
  uint uVar81;
  float fVar82;
  ai_real aVar83;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> targetMeshes;
  vector<float,_std::allocator<float>_> targetWeights;
  aiMesh *aimesh;
  vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
  dstBones;
  vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
  weightStartPerVertex;
  vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> animMeshes;
  int local_268;
  aiMesh **local_258;
  iterator iStack_250;
  aiMesh **local_248;
  Controller *local_240;
  void *local_238;
  iterator iStack_230;
  float *local_228;
  aiMesh *local_218 [2];
  undefined1 local_208 [24];
  aiVector3D *local_1f0;
  pointer local_1e0;
  Accessor *local_1d8;
  Accessor *local_1d0;
  aiColor4D *local_1c8;
  aiColor4D *paStack_1c0;
  aiColor4D *local_1b8;
  undefined1 local_1a8 [8];
  aiVertexWeight aStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_240 = pSrcController;
  paVar43 = (aiMesh *)operator_new(0x520);
  paVar43->mPrimitiveTypes = 0;
  paVar43->mNumVertices = 0;
  paVar43->mNumFaces = 0;
  __s = &paVar43->mVertices;
  memset(__s,0,0xcc);
  paVar43->mBones = (aiBone **)0x0;
  paVar43->mMaterialIndex = 0;
  (paVar43->mName).length = 0;
  (paVar43->mName).data[0] = '\0';
  memset((paVar43->mName).data + 1,0x1b,0x3ff);
  paVar43->mNumAnimMeshes = 0;
  paVar43->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar43->mMethod = 0;
  (paVar43->mAABB).mMin.x = 0.0;
  (paVar43->mAABB).mMin.y = 0.0;
  (paVar43->mAABB).mMin.z = 0.0;
  (paVar43->mAABB).mMax.x = 0.0;
  (paVar43->mAABB).mMax.y = 0.0;
  (paVar43->mAABB).mMax.z = 0.0;
  memset(paVar43->mColors,0,0xa0);
  uVar72 = (pSrcMesh->mName)._M_string_length;
  if (uVar72 < 0x400) {
    (paVar43->mName).length = (ai_uint32)uVar72;
    memcpy((paVar43->mName).data,(pSrcMesh->mName)._M_dataplus._M_p,uVar72);
    (paVar43->mName).data[uVar72] = '\0';
  }
  if (pSubMesh->mNumFaces == 0) {
    uVar72 = 0;
  }
  else {
    lVar70 = 0;
    uVar72 = 0;
    do {
      uVar72 = uVar72 + *(long *)((long)(pSrcMesh->mFaceSize).
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 lVar70 + pStartFace * 8);
      lVar70 = lVar70 + 8;
    } while (pSubMesh->mNumFaces << 3 != lVar70);
  }
  paVar43->mNumVertices = (uint)uVar72;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar72;
  sVar44 = SUB168(auVar11 * ZEXT816(0xc),0);
  uVar73 = 0xffffffffffffffff;
  if (SUB168(auVar11 * ZEXT816(0xc),8) == 0) {
    uVar73 = sVar44;
  }
  paVar45 = (aiVector3D *)operator_new__(uVar73);
  if (uVar72 == 0) {
    *__s = paVar45;
  }
  else {
    memset(paVar45,0,((sVar44 - 0xc) / 0xc) * 0xc + 0xc);
    *__s = paVar45;
    memmove(paVar45,(pSrcMesh->mPositions).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start + pStartVertex,sVar44);
  }
  paVar6 = (pSrcMesh->mNormals).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar67 = uVar72 + pStartVertex;
  if (uVar67 <= (ulong)(((long)(pSrcMesh->mNormals).
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)paVar6 >> 2) *
                       -0x5555555555555555)) {
    paVar45 = (aiVector3D *)operator_new__(uVar73);
    if (uVar72 == 0) {
      paVar43->mNormals = paVar45;
    }
    else {
      memset(paVar45,0,((sVar44 - 0xc) / 0xc) * 0xc + 0xc);
      paVar43->mNormals = paVar45;
      memmove(paVar45,paVar6 + pStartVertex,sVar44);
    }
  }
  paVar6 = (pSrcMesh->mTangents).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar67 <= (ulong)(((long)(pSrcMesh->mTangents).
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)paVar6 >> 2) *
                       -0x5555555555555555)) {
    paVar45 = (aiVector3D *)operator_new__(uVar73);
    if (uVar72 == 0) {
      paVar43->mTangents = paVar45;
    }
    else {
      memset(paVar45,0,((sVar44 - 0xc) / 0xc) * 0xc + 0xc);
      paVar43->mTangents = paVar45;
      memmove(paVar45,paVar6 + pStartVertex,sVar44);
    }
  }
  paVar6 = (pSrcMesh->mBitangents).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar67 <= (ulong)(((long)(pSrcMesh->mBitangents).
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)paVar6 >> 2) *
                       -0x5555555555555555)) {
    paVar45 = (aiVector3D *)operator_new__(uVar73);
    if (uVar72 == 0) {
      paVar43->mBitangents = paVar45;
    }
    else {
      memset(paVar45,0,((sVar44 - 0xc) / 0xc) * 0xc + 0xc);
      paVar43->mBitangents = paVar45;
      memmove(paVar45,paVar6 + pStartVertex,sVar44);
    }
  }
  lVar77 = 0;
  lVar70 = 0;
  do {
    if (uVar67 <= (ulong)(((long)pSrcMesh->mTexCoords[lVar77].
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)pSrcMesh->mTexCoords[lVar77].
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 2) *
                         -0x5555555555555555)) {
      paVar45 = (aiVector3D *)operator_new__(uVar73);
      if (uVar72 == 0) {
        paVar43->mTextureCoords[lVar70] = paVar45;
      }
      else {
        memset(paVar45,0,((sVar44 - 0xc) / 0xc) * 0xc + 0xc);
        paVar43->mTextureCoords[lVar70] = paVar45;
        lVar46 = 0;
        uVar68 = uVar72;
        do {
          paVar6 = pSrcMesh->mTexCoords[lVar77].
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          paVar45 = paVar43->mTextureCoords[lVar70];
          *(undefined4 *)((long)&paVar45->z + lVar46) =
               *(undefined4 *)((long)(paVar6 + pStartVertex) + 8U + lVar46);
          *(undefined8 *)((long)&paVar45->x + lVar46) =
               *(undefined8 *)((long)(paVar6 + pStartVertex) + lVar46);
          lVar46 = lVar46 + 0xc;
          uVar68 = uVar68 - 1;
        } while (uVar68 != 0);
      }
      paVar43->mNumUVComponents[lVar70] = pSrcMesh->mNumUVComponents[lVar77];
      lVar70 = lVar70 + 1;
    }
    lVar77 = lVar77 + 1;
  } while (lVar77 != 8);
  uVar73 = uVar72 << 4;
  lVar77 = 0;
  lVar70 = 0x178;
  do {
    if (uVar67 <= (ulong)(*(long *)((long)&(pSrcMesh->mName)._M_string_length + lVar70) -
                          *(long *)((long)&(pSrcMesh->mName)._M_dataplus._M_p + lVar70) >> 4)) {
      __s_00 = (aiColor4D *)operator_new__(-(ulong)(uVar72 >> 0x3c != 0) | uVar73);
      if (uVar72 == 0) {
        paVar43->mColors[lVar77] = __s_00;
      }
      else {
        memset(__s_00,0,uVar73);
        paVar43->mColors[lVar77] = __s_00;
        memmove(__s_00,(void *)(*(long *)((long)&(pSrcMesh->mName)._M_dataplus._M_p + lVar70) +
                               pStartVertex * 0x10),uVar73);
      }
      lVar77 = lVar77 + 1;
    }
    lVar70 = lVar70 + 0x18;
  } while (lVar70 != 0x238);
  uVar81 = (uint)pSubMesh->mNumFaces;
  uVar72 = pSubMesh->mNumFaces & 0xffffffff;
  paVar43->mNumFaces = uVar81;
  puVar47 = (ulong *)operator_new__(uVar72 * 0x10 + 8);
  *puVar47 = uVar72;
  paVar48 = (aiFace *)(puVar47 + 1);
  if (uVar81 != 0) {
    paVar69 = paVar48;
    do {
      paVar69->mNumIndices = 0;
      paVar69->mIndices = (uint *)0x0;
      paVar69 = paVar69 + 1;
    } while (paVar69 != paVar48 + uVar72);
  }
  paVar43->mFaces = paVar48;
  if (paVar43->mNumFaces != 0) {
    iVar71 = 0;
    uVar72 = 0;
    do {
      uVar73 = (pSrcMesh->mFaceSize).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar72 + pStartFace];
      paVar48 = paVar43->mFaces;
      paVar48[uVar72].mNumIndices = (uint)uVar73;
      puVar49 = (uint *)operator_new__(-(ulong)(uVar73 >> 0x3e != 0) | uVar73 * 4);
      paVar48[uVar72].mIndices = puVar49;
      if (uVar73 != 0) {
        uVar68 = 0;
        do {
          paVar48[uVar72].mIndices[uVar68] = iVar71 + (int)uVar68;
          uVar68 = uVar68 + 1;
        } while (uVar73 != uVar68);
        iVar71 = iVar71 + (int)uVar68;
      }
      uVar72 = uVar72 + 1;
    } while (uVar72 < paVar43->mNumFaces);
  }
  local_258 = (aiMesh **)0x0;
  iStack_250._M_current = (aiMesh **)0x0;
  local_248 = (aiMesh **)0x0;
  local_228 = (float *)0x0;
  local_238 = (void *)0x0;
  iStack_230._M_current = (float *)0x0;
  p_Var57 = (pParser->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(pParser->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var57 != p_Var2) {
    iVar71 = 0;
    do {
      ppMVar50 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Mesh*>
                           (pParser,&pParser->mMeshLibrary,(string *)&p_Var57[2]._M_parent);
      if (p_Var57[2]._M_color == _S_black) {
        sVar44 = ((*ppMVar50)->mName)._M_string_length;
        if ((sVar44 == (pSrcMesh->mName)._M_string_length) &&
           ((sVar44 == 0 ||
            (iVar42 = bcmp(((*ppMVar50)->mName)._M_dataplus._M_p,(pSrcMesh->mName)._M_dataplus._M_p,
                           sVar44), iVar42 == 0)))) {
          pAVar51 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                              (pParser,&pParser->mAccessorLibrary,(string *)&p_Var57[0xc]._M_right);
          pAVar52 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                              (pParser,&pParser->mAccessorLibrary,(string *)&p_Var57[0xd]._M_right);
          pDVar53 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                              (pParser,&pParser->mDataLibrary,&pAVar51->mSource);
          pDVar54 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                              (pParser,&pParser->mDataLibrary,&pAVar52->mSource);
          if (pDVar53->mIsStringArray == false) {
            prVar66 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_1a8 = (undefined1  [8])local_198;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"target data must contain id. ","");
            std::runtime_error::runtime_error(prVar66,(string *)local_1a8);
            *(undefined ***)prVar66 = &PTR__runtime_error_008dc448;
            __cxa_throw(prVar66,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          if (pDVar54->mIsStringArray != false) {
            prVar66 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_1a8 = (undefined1  [8])local_198;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"target weight data must not be textual ","");
            std::runtime_error::runtime_error(prVar66,(string *)local_1a8);
            *(undefined ***)prVar66 = &PTR__runtime_error_008dc448;
            __cxa_throw(prVar66,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          iVar71 = *(int *)&p_Var57[2].field_0x4;
          pbVar55 = (pDVar53->mStrings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pDVar53->mStrings).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != pbVar55) {
            uVar72 = 0;
            uVar73 = 1;
            do {
              ppMVar50 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Mesh*>
                                   (pParser,&pParser->mMeshLibrary,pbVar55 + uVar72);
              pSrcMesh_00 = *ppMVar50;
              local_218[0] = findMesh(this,&pSrcMesh_00->mName);
              if (local_218[0] == (aiMesh *)0x0) {
                pSubMesh_00 = (pSrcMesh_00->mSubMeshes).
                              super__Vector_base<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                lVar70 = (long)(pSrcMesh_00->mSubMeshes).
                               super__Vector_base<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pSubMesh_00;
                if (1 < (ulong)((lVar70 >> 3) * -0x3333333333333333)) {
                  prVar66 = (runtime_error *)__cxa_allocate_exception(0x10);
                  local_1a8 = (undefined1  [8])local_198;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1a8,"Morhing target mesh must be a single","");
                  std::runtime_error::runtime_error(prVar66,(string *)local_1a8);
                  *(undefined ***)prVar66 = &PTR__runtime_error_008dc448;
                  __cxa_throw(prVar66,&DeadlyImportError::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                if (lVar70 != 0x28) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,0);
                }
                local_218[0] = CreateMesh(this,pParser,pSrcMesh_00,pSubMesh_00,(Controller *)0x0,0,0
                                         );
                __position._M_current =
                     (this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                            ((vector<aiMesh*,std::allocator<aiMesh*>> *)&this->mTargetMeshes,
                             __position,local_218);
                }
                else {
                  *__position._M_current = local_218[0];
                  pppaVar3 = &(this->mTargetMeshes).
                              super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  *pppaVar3 = *pppaVar3 + 1;
                }
              }
              if (iStack_250._M_current == local_248) {
                std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                          ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_258,iStack_250,
                           local_218);
              }
              else {
                *iStack_250._M_current = local_218[0];
                iStack_250._M_current = iStack_250._M_current + 1;
              }
              pbVar55 = (pDVar53->mStrings).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              bVar10 = uVar73 < (ulong)((long)(pDVar53->mStrings).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pbVar55 >> 5);
              uVar72 = uVar73;
              uVar73 = (ulong)((int)uVar73 + 1);
            } while (bVar10);
          }
          pfVar56 = (pDVar54->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((pDVar54->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish != pfVar56) {
            uVar72 = 0;
            uVar73 = 1;
            do {
              if (iStack_230._M_current == local_228) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&local_238,iStack_230,
                           pfVar56 + uVar72);
              }
              else {
                *iStack_230._M_current = pfVar56[uVar72];
                iStack_230._M_current = iStack_230._M_current + 1;
              }
              pfVar56 = (pDVar54->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl
                        .super__Vector_impl_data._M_start;
              bVar10 = uVar73 < (ulong)((long)(pDVar54->mValues).
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                        (long)pfVar56 >> 2);
              uVar72 = uVar73;
              uVar73 = (ulong)((int)uVar73 + 1);
            } while (bVar10);
          }
        }
      }
      p_Var57 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var57);
    } while ((_Rb_tree_header *)p_Var57 != p_Var2);
    if (((long)iStack_250._M_current - (long)local_258 != 0) &&
       ((long)iStack_230._M_current - (long)local_238 >> 2 ==
        (long)iStack_250._M_current - (long)local_258 >> 3)) {
      local_1a8._0_4_ = 0;
      local_1a8._4_4_ = 0.0;
      aStack_1a0.mVertexId = 0;
      aStack_1a0.mWeight = 0.0;
      local_198[0]._0_4_ = 0;
      local_198[0]._4_4_ = 0.0;
      if (iStack_250._M_current != local_258) {
        uVar72 = 0;
        uVar73 = 1;
        do {
          mesh = local_258[uVar72];
          paVar58 = (aiMesh *)aiCreateAnimMesh(mesh);
          fVar82 = *(float *)((long)local_238 + uVar72 * 4);
          uVar81 = -(uint)(fVar82 == 0.0);
          *(uint *)((paVar58->mName).data + 0x3bc) = uVar81 & 0x3f800000 | ~uVar81 & (uint)fVar82;
          local_218[0] = paVar58;
          if (paVar58 != (aiMesh *)&mesh->mName) {
            uVar81 = (mesh->mName).length;
            paVar58->mPrimitiveTypes = uVar81;
            memcpy(&paVar58->mNumVertices,(mesh->mName).data,(ulong)uVar81);
            *(undefined1 *)((long)paVar58->mColors + ((ulong)uVar81 - 0x2c)) = 0;
          }
          if (aStack_1a0 == (aiVertexWeight)local_198[0]._0_8_) {
            std::vector<aiAnimMesh*,std::allocator<aiAnimMesh*>>::
            _M_realloc_insert<aiAnimMesh*const&>
                      ((vector<aiAnimMesh*,std::allocator<aiAnimMesh*>> *)local_1a8,
                       (iterator)aStack_1a0,(aiAnimMesh **)local_218);
          }
          else {
            *(aiMesh **)aStack_1a0 = local_218[0];
            aStack_1a0 = (aiVertexWeight)((long)aStack_1a0 + 8);
          }
          bVar10 = uVar73 < (ulong)((long)iStack_250._M_current - (long)local_258 >> 3);
          uVar72 = uVar73;
          uVar73 = (ulong)((int)uVar73 + 1);
        } while (bVar10);
      }
      aVar78 = (aiVertexWeight)local_1a8;
      paVar43->mMethod = iVar71 == 1 | 2;
      uVar72 = (long)aStack_1a0 - (long)local_1a8 >> 3;
      ppaVar59 = (aiAnimMesh **)
                 operator_new__(-(ulong)(uVar72 >> 0x3d != 0) | (long)aStack_1a0 - (long)local_1a8);
      paVar43->mAnimMeshes = ppaVar59;
      paVar43->mNumAnimMeshes = (uint)uVar72;
      if (aStack_1a0 != aVar78) {
        uVar81 = 1;
        uVar72 = 0;
        do {
          paVar43->mAnimMeshes[uVar72] = *(aiAnimMesh **)((long)aVar78 + uVar72 * 8);
          uVar72 = (ulong)uVar81;
          uVar81 = uVar81 + 1;
          aVar78 = (aiVertexWeight)local_1a8;
        } while (uVar72 < (ulong)((long)aStack_1a0 - (long)local_1a8 >> 3));
      }
      if (aVar78 != (aiVertexWeight)0x0) {
        operator_delete((void *)aVar78);
      }
    }
  }
  pCVar79 = local_240;
  if ((local_240 != (Controller *)0x0) && (local_240->mType == Skin)) {
    pLibrary = &pParser->mAccessorLibrary;
    pAVar51 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                        (pParser,pLibrary,&local_240->mJointNameSource);
    pLibrary_00 = &pParser->mDataLibrary;
    pDVar53 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                        (pParser,pLibrary_00,&pAVar51->mSource);
    pAVar52 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                        (pParser,pLibrary,&pCVar79->mJointOffsetMatrixSource);
    pDVar54 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                        (pParser,pLibrary_00,&pAVar52->mSource);
    pAVar60 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                        (pParser,pLibrary,&(pCVar79->mWeightInputJoints).mAccessor);
    if (pAVar60 != pAVar51) {
      prVar66 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,
                 "Temporary implementational laziness. If you read this, please report to the author."
                 ,"");
      std::runtime_error::runtime_error(prVar66,(string *)local_1a8);
      *(undefined ***)prVar66 = &PTR__runtime_error_008dc448;
      __cxa_throw(prVar66,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1d0 = pAVar52;
    pAVar52 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                        (pParser,pLibrary,&(pCVar79->mWeightInputWeights).mAccessor);
    pData = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                      (pParser,pLibrary_00,&pAVar52->mSource);
    if (((pDVar53->mIsStringArray != true) || (pDVar54->mIsStringArray != false)) ||
       (pData->mIsStringArray == true)) {
      prVar66 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"Data type mismatch while resolving mesh joints","");
      std::runtime_error::runtime_error(prVar66,(string *)local_1a8);
      *(undefined ***)prVar66 = &PTR__runtime_error_008dc448;
      __cxa_throw(prVar66,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (((pCVar79->mWeightInputJoints).mOffset != 0) ||
       ((pCVar79->mWeightInputWeights).mOffset != 1)) {
      prVar66 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"Unsupported vertex_weight addressing scheme. ","");
      std::runtime_error::runtime_error(prVar66,(string *)local_1a8);
      *(undefined ***)prVar66 = &PTR__runtime_error_008dc448;
      __cxa_throw(prVar66,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pbVar55 = (pDVar53->mStrings).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar7 = (pDVar53->mStrings).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __n = (long)pbVar7 - (long)pbVar55 >> 5;
    std::
    vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
    ::vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
              *)(local_208 + 0x10),__n,(allocator_type *)local_1a8);
    pCVar74 = (ColladaLoader *)&local_1c8;
    local_1c8 = (aiColor4D *)0x0;
    paStack_1c0 = (aiColor4D *)0x0;
    local_1b8 = (aiColor4D *)0x0;
    local_1a8 = (undefined1  [8])
                (pCVar79->mWeights).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    std::
    vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
    ::resize((vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
              *)pCVar74,
             (long)(pCVar79->mWeightCounts).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pCVar79->mWeightCounts).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(value_type *)local_1a8);
    if ((pCVar79->mWeightCounts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (pCVar79->mWeightCounts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      ppVar61 = (pCVar79->mWeights).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar72 = 0;
      do {
        *(pointer *)(&local_1c8->r + uVar72 * 2) = ppVar61;
        puVar8 = (pCVar79->mWeightCounts).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pCVar74 = (ColladaLoader *)(puVar8[uVar72] * 0x10);
        ppVar61 = (pointer)((long)&ppVar61->first +
                           (long)&(pCVar74->super_BaseImporter)._vptr_BaseImporter);
        uVar72 = uVar72 + 1;
      } while (uVar72 < (ulong)((long)(pCVar79->mWeightCounts).
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3
                               ));
    }
    uVar72 = pStartVertex;
    local_1e0 = pbVar55;
    local_1d8 = pAVar51;
    if (pStartVertex < uVar67) {
      do {
        uVar9 = (pSrcMesh->mFacePosIndices).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar72];
        uVar80 = (pCVar79->mWeightCounts).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9];
        if (uVar80 != 0) {
          local_268 = (int)pStartVertex;
          uVar81 = (int)uVar72 - local_268;
          psVar75 = (size_t *)(*(long *)(&local_1c8->r + uVar9 * 2) + 8);
          do {
            sVar76 = psVar75[-1];
            fVar82 = 1.0;
            if (((pData->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start ==
                 (pData->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish) ||
               (fVar82 = ReadFloat(pCVar74,pAVar52,pData,*psVar75,0), 0.0 < fVar82)) {
              local_1a8._4_4_ = fVar82;
              local_1a8._0_4_ = uVar81;
              pCVar74 = (ColladaLoader *)(local_208._16_8_ + sVar76 * 2 * 0xc);
              __position_00._M_current =
                   *(aiVertexWeight **)&(pCVar74->super_BaseImporter).importerUnits._M_t._M_impl;
              if (__position_00._M_current ==
                  *(aiVertexWeight **)
                   &(pCVar74->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header.
                    _M_header) {
                std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>::
                _M_realloc_insert<aiVertexWeight_const&>
                          ((vector<aiVertexWeight,std::allocator<aiVertexWeight>> *)pCVar74,
                           __position_00,(aiVertexWeight *)local_1a8);
              }
              else {
                (__position_00._M_current)->mVertexId = uVar81;
                (__position_00._M_current)->mWeight = fVar82;
                pmVar1 = &(pCVar74->super_BaseImporter).importerUnits;
                *(long *)&(pmVar1->_M_t)._M_impl = *(long *)&(pmVar1->_M_t)._M_impl + 8;
              }
            }
            psVar75 = psVar75 + 2;
            uVar80 = uVar80 - 1;
          } while (uVar80 != 0);
        }
        uVar72 = uVar72 + 1;
        pCVar79 = local_240;
      } while (uVar72 != uVar67);
    }
    if ((aiVector3D *)local_208._16_8_ == local_1f0) {
      paVar43->mNumBones = 0;
      uVar72 = 0;
    }
    else {
      uVar72 = 0;
      paVar45 = (aiVector3D *)local_208._16_8_;
      do {
        lVar70._0_4_ = paVar45->x;
        lVar70._4_4_ = paVar45->y;
        uVar72 = uVar72 + (*(long *)&paVar45->z != lVar70);
        paVar45 = paVar45 + 2;
      } while (paVar45 != local_1f0);
      paVar43->mNumBones = (uint)uVar72;
      uVar72 = -(ulong)(uVar72 >> 0x3d != 0) | uVar72 * 8;
    }
    ppaVar62 = (aiBone **)operator_new__(uVar72);
    paVar43->mBones = ppaVar62;
    if (pbVar7 != local_1e0) {
      lVar70 = 8;
      sVar76 = 0;
      lVar77 = 0;
      do {
        if (*(long *)(local_208._16_8_ + lVar70 + -8) !=
            *(long *)((long)(float *)local_208._16_8_ + lVar70)) {
          paVar63 = (aiBone *)operator_new(0x450);
          (paVar63->mName).length = 0;
          __s_01 = (paVar63->mName).data;
          (paVar63->mName).data[0] = '\0';
          pCVar74 = (ColladaLoader *)((paVar63->mName).data + 1);
          memset(pCVar74,0x1b,0x3ff);
          paVar63->mNumWeights = 0;
          paVar63->mWeights = (aiVertexWeight *)0x0;
          (paVar63->mOffsetMatrix).a1 = 1.0;
          (paVar63->mOffsetMatrix).a2 = 0.0;
          (paVar63->mOffsetMatrix).a3 = 0.0;
          (paVar63->mOffsetMatrix).a4 = 0.0;
          (paVar63->mOffsetMatrix).b1 = 0.0;
          (paVar63->mOffsetMatrix).b2 = 1.0;
          (paVar63->mOffsetMatrix).b3 = 0.0;
          (paVar63->mOffsetMatrix).b4 = 0.0;
          (paVar63->mOffsetMatrix).c1 = 0.0;
          (paVar63->mOffsetMatrix).c2 = 0.0;
          (paVar63->mOffsetMatrix).c3 = 1.0;
          (paVar63->mOffsetMatrix).c4 = 0.0;
          (paVar63->mOffsetMatrix).d1 = 0.0;
          (paVar63->mOffsetMatrix).d2 = 0.0;
          (paVar63->mOffsetMatrix).d3 = 0.0;
          (paVar63->mOffsetMatrix).d4 = 1.0;
          psVar64 = ReadString_abi_cxx11_(pCVar74,local_1d8,pDVar53,sVar76);
          uVar72 = psVar64->_M_string_length;
          if (uVar72 < 0x400) {
            (paVar63->mName).length = (ai_uint32)uVar72;
            pCVar74 = (ColladaLoader *)__s_01;
            memcpy(__s_01,(psVar64->_M_dataplus)._M_p,uVar72);
            (paVar63->mName).data[uVar72] = '\0';
          }
          pAVar51 = local_1d0;
          aVar83 = ReadFloat(pCVar74,local_1d0,pDVar54,sVar76,0);
          (paVar63->mOffsetMatrix).a1 = aVar83;
          aVar83 = ReadFloat(pCVar74,pAVar51,pDVar54,sVar76,1);
          (paVar63->mOffsetMatrix).a2 = aVar83;
          aVar83 = ReadFloat(pCVar74,pAVar51,pDVar54,sVar76,2);
          (paVar63->mOffsetMatrix).a3 = aVar83;
          aVar83 = ReadFloat(pCVar74,pAVar51,pDVar54,sVar76,3);
          (paVar63->mOffsetMatrix).a4 = aVar83;
          aVar83 = ReadFloat(pCVar74,pAVar51,pDVar54,sVar76,4);
          (paVar63->mOffsetMatrix).b1 = aVar83;
          aVar83 = ReadFloat(pCVar74,pAVar51,pDVar54,sVar76,5);
          (paVar63->mOffsetMatrix).b2 = aVar83;
          aVar83 = ReadFloat(pCVar74,pAVar51,pDVar54,sVar76,6);
          (paVar63->mOffsetMatrix).b3 = aVar83;
          aVar83 = ReadFloat(pCVar74,pAVar51,pDVar54,sVar76,7);
          (paVar63->mOffsetMatrix).b4 = aVar83;
          aVar83 = ReadFloat(pCVar74,pAVar51,pDVar54,sVar76,8);
          (paVar63->mOffsetMatrix).c1 = aVar83;
          aVar83 = ReadFloat(pCVar74,pAVar51,pDVar54,sVar76,9);
          (paVar63->mOffsetMatrix).c2 = aVar83;
          aVar83 = ReadFloat(pCVar74,pAVar51,pDVar54,sVar76,10);
          (paVar63->mOffsetMatrix).c3 = aVar83;
          aVar83 = ReadFloat(pCVar74,pAVar51,pDVar54,sVar76,0xb);
          uVar40 = local_208._16_8_;
          (paVar63->mOffsetMatrix).c4 = aVar83;
          uVar73 = *(long *)((long)(float *)local_208._16_8_ + lVar70) -
                   *(long *)(local_208._16_8_ + lVar70 + -8) >> 3;
          paVar63->mNumWeights = (uint)uVar73;
          uVar73 = uVar73 & 0xffffffff;
          uVar72 = uVar73 * 8;
          __s_02 = (aiVertexWeight *)operator_new__(uVar72);
          if (uVar73 != 0) {
            memset(__s_02,0,uVar72);
          }
          pCVar79 = local_240;
          paVar63->mWeights = __s_02;
          __src = *(void **)(uVar40 + lVar70 + -8);
          sVar44 = *(long *)((long)(float *)uVar40 + lVar70) - (long)__src;
          if (sVar44 != 0) {
            memmove(__s_02,__src,sVar44);
          }
          fVar12 = (paVar63->mOffsetMatrix).a1;
          fVar13 = (paVar63->mOffsetMatrix).a2;
          fVar14 = (paVar63->mOffsetMatrix).a3;
          fVar15 = (paVar63->mOffsetMatrix).a4;
          fVar16 = (paVar63->mOffsetMatrix).b1;
          fVar17 = (paVar63->mOffsetMatrix).b2;
          fVar18 = (paVar63->mOffsetMatrix).b3;
          fVar19 = (paVar63->mOffsetMatrix).b4;
          fVar20 = (paVar63->mOffsetMatrix).c1;
          fVar21 = (paVar63->mOffsetMatrix).c2;
          fVar22 = (paVar63->mOffsetMatrix).c3;
          fVar23 = (paVar63->mOffsetMatrix).d1;
          fVar24 = pCVar79->mBindShapeMatrix[0];
          fVar25 = pCVar79->mBindShapeMatrix[1];
          fVar26 = pCVar79->mBindShapeMatrix[2];
          fVar27 = pCVar79->mBindShapeMatrix[3];
          fVar28 = pCVar79->mBindShapeMatrix[4];
          fVar29 = pCVar79->mBindShapeMatrix[5];
          fVar30 = pCVar79->mBindShapeMatrix[6];
          fVar31 = pCVar79->mBindShapeMatrix[7];
          fVar32 = pCVar79->mBindShapeMatrix[8];
          fVar33 = pCVar79->mBindShapeMatrix[9];
          fVar34 = pCVar79->mBindShapeMatrix[10];
          fVar35 = pCVar79->mBindShapeMatrix[0xb];
          fVar36 = pCVar79->mBindShapeMatrix[0xc];
          fVar37 = pCVar79->mBindShapeMatrix[0xd];
          fVar38 = pCVar79->mBindShapeMatrix[0xe];
          fVar39 = pCVar79->mBindShapeMatrix[0xf];
          fVar82 = (paVar63->mOffsetMatrix).d2;
          fVar4 = (paVar63->mOffsetMatrix).d3;
          fVar5 = (paVar63->mOffsetMatrix).d4;
          (paVar63->mOffsetMatrix).a1 =
               fVar15 * fVar36 + fVar14 * fVar32 + fVar12 * fVar24 + fVar13 * fVar28;
          (paVar63->mOffsetMatrix).a2 =
               fVar15 * fVar37 + fVar14 * fVar33 + fVar12 * fVar25 + fVar13 * fVar29;
          (paVar63->mOffsetMatrix).a3 =
               fVar15 * fVar38 + fVar14 * fVar34 + fVar12 * fVar26 + fVar13 * fVar30;
          (paVar63->mOffsetMatrix).a4 =
               fVar15 * fVar39 + fVar14 * fVar35 + fVar12 * fVar27 + fVar13 * fVar31;
          (paVar63->mOffsetMatrix).b1 =
               fVar19 * fVar36 + fVar18 * fVar32 + fVar16 * fVar24 + fVar17 * fVar28;
          (paVar63->mOffsetMatrix).b2 =
               fVar19 * fVar37 + fVar18 * fVar33 + fVar16 * fVar25 + fVar17 * fVar29;
          (paVar63->mOffsetMatrix).b3 =
               fVar19 * fVar38 + fVar18 * fVar34 + fVar16 * fVar26 + fVar17 * fVar30;
          (paVar63->mOffsetMatrix).b4 =
               fVar19 * fVar39 + fVar18 * fVar35 + fVar16 * fVar27 + fVar17 * fVar31;
          (paVar63->mOffsetMatrix).c1 =
               aVar83 * fVar36 + fVar22 * fVar32 + fVar20 * fVar24 + fVar21 * fVar28;
          (paVar63->mOffsetMatrix).c2 =
               aVar83 * fVar37 + fVar22 * fVar33 + fVar20 * fVar25 + fVar21 * fVar29;
          (paVar63->mOffsetMatrix).c3 =
               aVar83 * fVar38 + fVar22 * fVar34 + fVar20 * fVar26 + fVar21 * fVar30;
          (paVar63->mOffsetMatrix).c4 =
               aVar83 * fVar39 + fVar22 * fVar35 + fVar20 * fVar27 + fVar21 * fVar31;
          (paVar63->mOffsetMatrix).d1 =
               fVar5 * fVar36 + fVar4 * fVar32 + fVar23 * fVar24 + fVar82 * fVar28;
          (paVar63->mOffsetMatrix).d2 =
               fVar5 * fVar37 + fVar4 * fVar33 + fVar23 * fVar25 + fVar82 * fVar29;
          (paVar63->mOffsetMatrix).d3 =
               fVar5 * fVar38 + fVar4 * fVar34 + fVar23 * fVar26 + fVar82 * fVar30;
          (paVar63->mOffsetMatrix).d4 =
               fVar5 * fVar39 + fVar4 * fVar35 + fVar23 * fVar27 + fVar82 * fVar31;
          pNVar65 = pParser->mRootNode;
          local_1a8 = (undefined1  [8])local_198;
          sVar44 = strlen(__s_01);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,__s_01,__s_01 + sVar44);
          pNVar65 = FindNode(this,pNVar65,(string *)local_1a8);
          if (local_1a8 != (undefined1  [8])local_198) {
            operator_delete((void *)local_1a8);
          }
          if (pNVar65 == (Node *)0x0) {
            pNVar65 = pParser->mRootNode;
            local_1a8 = (undefined1  [8])local_198;
            sVar44 = strlen(__s_01);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,__s_01,__s_01 + sVar44);
            pNVar65 = FindNodeBySID(this,pNVar65,(string *)local_1a8);
            if (local_1a8 != (undefined1  [8])local_198) {
              operator_delete((void *)local_1a8);
            }
            if (pNVar65 != (Node *)0x0) goto LAB_003e8723;
            this_00 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[75]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,
                       (char (*) [75])
                       "ColladaLoader::CreateMesh(): could not find corresponding node for joint \""
                      );
            sVar44 = strlen(__s_01);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s_01,sVar44);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
            std::__cxx11::stringbuf::str();
            Logger::warn(this_00,(char *)local_218[0]);
            if (local_218[0] != (aiMesh *)local_208) {
              operator_delete(local_218[0]);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
          else {
LAB_003e8723:
            FindNameForNode_abi_cxx11_((string *)local_1a8,this,pNVar65);
            aVar78 = aStack_1a0;
            auVar41 = local_1a8;
            if ((ulong)aStack_1a0 < 0x400) {
              (paVar63->mName).length = aStack_1a0.mVertexId;
              memcpy(__s_01,(void *)local_1a8,(size_t)aStack_1a0);
              (paVar63->mName).data[(long)aVar78] = '\0';
            }
            if (auVar41 != (undefined1  [8])local_198) {
              operator_delete((void *)auVar41);
            }
          }
          paVar43->mBones[lVar77] = paVar63;
          lVar77 = lVar77 + 1;
        }
        sVar76 = sVar76 + 1;
        lVar70 = lVar70 + 0x18;
      } while (__n + (__n == 0) != sVar76);
    }
    if (local_1c8 != (aiColor4D *)0x0) {
      operator_delete(local_1c8);
    }
    std::
    vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
    ::~vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
               *)(local_208 + 0x10));
  }
  if (local_238 != (void *)0x0) {
    operator_delete(local_238);
  }
  if (local_258 != (aiMesh **)0x0) {
    operator_delete(local_258);
  }
  return paVar43;
}

Assistant:

aiMesh* ColladaLoader::CreateMesh(const ColladaParser& pParser, const Collada::Mesh* pSrcMesh, const Collada::SubMesh& pSubMesh,
    const Collada::Controller* pSrcController, size_t pStartVertex, size_t pStartFace) {
    std::unique_ptr<aiMesh> dstMesh(new aiMesh);

    dstMesh->mName = pSrcMesh->mName;

    // count the vertices addressed by its faces
    const size_t numVertices = std::accumulate(pSrcMesh->mFaceSize.begin() + pStartFace,
        pSrcMesh->mFaceSize.begin() + pStartFace + pSubMesh.mNumFaces, size_t(0));

    // copy positions
    dstMesh->mNumVertices = static_cast<unsigned int>(numVertices);
    dstMesh->mVertices = new aiVector3D[numVertices];
    std::copy(pSrcMesh->mPositions.begin() + pStartVertex, pSrcMesh->mPositions.begin() +
        pStartVertex + numVertices, dstMesh->mVertices);

    // normals, if given. HACK: (thom) Due to the glorious Collada spec we never
    // know if we have the same number of normals as there are positions. So we
    // also ignore any vertex attribute if it has a different count
    if (pSrcMesh->mNormals.size() >= pStartVertex + numVertices) {
        dstMesh->mNormals = new aiVector3D[numVertices];
        std::copy(pSrcMesh->mNormals.begin() + pStartVertex, pSrcMesh->mNormals.begin() +
            pStartVertex + numVertices, dstMesh->mNormals);
    }

    // tangents, if given.
    if (pSrcMesh->mTangents.size() >= pStartVertex + numVertices) {
        dstMesh->mTangents = new aiVector3D[numVertices];
        std::copy(pSrcMesh->mTangents.begin() + pStartVertex, pSrcMesh->mTangents.begin() +
            pStartVertex + numVertices, dstMesh->mTangents);
    }

    // bitangents, if given.
    if (pSrcMesh->mBitangents.size() >= pStartVertex + numVertices) {
        dstMesh->mBitangents = new aiVector3D[numVertices];
        std::copy(pSrcMesh->mBitangents.begin() + pStartVertex, pSrcMesh->mBitangents.begin() +
            pStartVertex + numVertices, dstMesh->mBitangents);
    }

    // same for texturecoords, as many as we have
    // empty slots are not allowed, need to pack and adjust UV indexes accordingly
    for (size_t a = 0, real = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a) {
        if (pSrcMesh->mTexCoords[a].size() >= pStartVertex + numVertices) {
            dstMesh->mTextureCoords[real] = new aiVector3D[numVertices];
            for (size_t b = 0; b < numVertices; ++b) {
                dstMesh->mTextureCoords[real][b] = pSrcMesh->mTexCoords[a][pStartVertex + b];
            }

            dstMesh->mNumUVComponents[real] = pSrcMesh->mNumUVComponents[a];
            ++real;
        }
    }

    // same for vertex colors, as many as we have. again the same packing to avoid empty slots
    for (size_t a = 0, real = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a) {
        if (pSrcMesh->mColors[a].size() >= pStartVertex + numVertices) {
            dstMesh->mColors[real] = new aiColor4D[numVertices];
            std::copy(pSrcMesh->mColors[a].begin() + pStartVertex, pSrcMesh->mColors[a].begin() + pStartVertex + numVertices, dstMesh->mColors[real]);
            ++real;
        }
    }

    // create faces. Due to the fact that each face uses unique vertices, we can simply count up on each vertex
    size_t vertex = 0;
    dstMesh->mNumFaces = static_cast<unsigned int>(pSubMesh.mNumFaces);
    dstMesh->mFaces = new aiFace[dstMesh->mNumFaces];
    for (size_t a = 0; a < dstMesh->mNumFaces; ++a) {
        size_t s = pSrcMesh->mFaceSize[pStartFace + a];
        aiFace& face = dstMesh->mFaces[a];
        face.mNumIndices = static_cast<unsigned int>(s);
        face.mIndices = new unsigned int[s];
        for (size_t b = 0; b < s; ++b) {
            face.mIndices[b] = static_cast<unsigned int>(vertex++);
        }
    }

    // create morph target meshes if any
    std::vector<aiMesh*> targetMeshes;
    std::vector<float> targetWeights;
    Collada::MorphMethod method = Collada::Normalized;

    for (std::map<std::string, Collada::Controller>::const_iterator it = pParser.mControllerLibrary.begin();
        it != pParser.mControllerLibrary.end(); ++it) {
        const Collada::Controller &c = it->second;
        const Collada::Mesh* baseMesh = pParser.ResolveLibraryReference(pParser.mMeshLibrary, c.mMeshId);

        if (c.mType == Collada::Morph && baseMesh->mName == pSrcMesh->mName) {
            const Collada::Accessor& targetAccessor = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, c.mMorphTarget);
            const Collada::Accessor& weightAccessor = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, c.mMorphWeight);
            const Collada::Data& targetData = pParser.ResolveLibraryReference(pParser.mDataLibrary, targetAccessor.mSource);
            const Collada::Data& weightData = pParser.ResolveLibraryReference(pParser.mDataLibrary, weightAccessor.mSource);

            // take method
            method = c.mMethod;

            if (!targetData.mIsStringArray) {
                throw DeadlyImportError("target data must contain id. ");
            }
            if (weightData.mIsStringArray) {
                throw DeadlyImportError("target weight data must not be textual ");
            }

            for (unsigned int i = 0; i < targetData.mStrings.size(); ++i) {
                const Collada::Mesh* targetMesh = pParser.ResolveLibraryReference(pParser.mMeshLibrary, targetData.mStrings.at(i));

                aiMesh *aimesh = findMesh(targetMesh->mName);
                if (!aimesh) {
                    if (targetMesh->mSubMeshes.size() > 1) {
                        throw DeadlyImportError("Morhing target mesh must be a single");
                    }
                    aimesh = CreateMesh(pParser, targetMesh, targetMesh->mSubMeshes.at(0), NULL, 0, 0);
                    mTargetMeshes.push_back(aimesh);
                }
                targetMeshes.push_back(aimesh);
            }
            for (unsigned int i = 0; i < weightData.mValues.size(); ++i) {
                targetWeights.push_back(weightData.mValues.at(i));
            }
        }
    }
    if (targetMeshes.size() > 0 && targetWeights.size() == targetMeshes.size()) {
        std::vector<aiAnimMesh*> animMeshes;
        for (unsigned int i = 0; i < targetMeshes.size(); ++i) {
            aiMesh* targetMesh = targetMeshes.at(i);
            aiAnimMesh *animMesh = aiCreateAnimMesh(targetMesh);
            float weight = targetWeights[i];
            animMesh->mWeight = weight == 0 ? 1.0f : weight;
            animMesh->mName = targetMesh->mName;
            animMeshes.push_back(animMesh);
        }
        dstMesh->mMethod = (method == Collada::Relative)
            ? aiMorphingMethod_MORPH_RELATIVE
            : aiMorphingMethod_MORPH_NORMALIZED;
        dstMesh->mAnimMeshes = new aiAnimMesh*[animMeshes.size()];
        dstMesh->mNumAnimMeshes = static_cast<unsigned int>(animMeshes.size());
        for (unsigned int i = 0; i < animMeshes.size(); ++i) {
            dstMesh->mAnimMeshes[i] = animMeshes.at(i);
        }
    }

    // create bones if given
    if (pSrcController && pSrcController->mType == Collada::Skin) {
        // resolve references - joint names
        const Collada::Accessor& jointNamesAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mJointNameSource);
        const Collada::Data& jointNames = pParser.ResolveLibraryReference(pParser.mDataLibrary, jointNamesAcc.mSource);
        // joint offset matrices
        const Collada::Accessor& jointMatrixAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mJointOffsetMatrixSource);
        const Collada::Data& jointMatrices = pParser.ResolveLibraryReference(pParser.mDataLibrary, jointMatrixAcc.mSource);
        // joint vertex_weight name list - should refer to the same list as the joint names above. If not, report and reconsider
        const Collada::Accessor& weightNamesAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mWeightInputJoints.mAccessor);
        if (&weightNamesAcc != &jointNamesAcc)
            throw DeadlyImportError("Temporary implementational laziness. If you read this, please report to the author.");
        // vertex weights
        const Collada::Accessor& weightsAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mWeightInputWeights.mAccessor);
        const Collada::Data& weights = pParser.ResolveLibraryReference(pParser.mDataLibrary, weightsAcc.mSource);

        if (!jointNames.mIsStringArray || jointMatrices.mIsStringArray || weights.mIsStringArray)
            throw DeadlyImportError("Data type mismatch while resolving mesh joints");
        // sanity check: we rely on the vertex weights always coming as pairs of BoneIndex-WeightIndex
        if (pSrcController->mWeightInputJoints.mOffset != 0 || pSrcController->mWeightInputWeights.mOffset != 1)
            throw DeadlyImportError("Unsupported vertex_weight addressing scheme. ");

        // create containers to collect the weights for each bone
        size_t numBones = jointNames.mStrings.size();
        std::vector<std::vector<aiVertexWeight> > dstBones(numBones);

        // build a temporary array of pointers to the start of each vertex's weights
        typedef std::vector< std::pair<size_t, size_t> > IndexPairVector;
        std::vector<IndexPairVector::const_iterator> weightStartPerVertex;
        weightStartPerVertex.resize(pSrcController->mWeightCounts.size(), pSrcController->mWeights.end());

        IndexPairVector::const_iterator pit = pSrcController->mWeights.begin();
        for (size_t a = 0; a < pSrcController->mWeightCounts.size(); ++a) {
            weightStartPerVertex[a] = pit;
            pit += pSrcController->mWeightCounts[a];
        }

        // now for each vertex put the corresponding vertex weights into each bone's weight collection
        for (size_t a = pStartVertex; a < pStartVertex + numVertices; ++a) {
            // which position index was responsible for this vertex? that's also the index by which
            // the controller assigns the vertex weights
            size_t orgIndex = pSrcMesh->mFacePosIndices[a];
            // find the vertex weights for this vertex
            IndexPairVector::const_iterator iit = weightStartPerVertex[orgIndex];
            size_t pairCount = pSrcController->mWeightCounts[orgIndex];


            for( size_t b = 0; b < pairCount; ++b, ++iit) {
                const size_t jointIndex = iit->first;
                const size_t vertexIndex = iit->second;                
                ai_real weight = 1.0f;
                if (!weights.mValues.empty()) {
                    weight = ReadFloat(weightsAcc, weights, vertexIndex, 0);
                }

                // one day I gonna kill that XSI Collada exporter
                if (weight > 0.0f)
                {
                    aiVertexWeight w;
                    w.mVertexId = static_cast<unsigned int>(a - pStartVertex);
                    w.mWeight = weight;
                    dstBones[jointIndex].push_back(w);
                }
            }
        }

        // count the number of bones which influence vertices of the current submesh
        size_t numRemainingBones = 0;
        for( std::vector<std::vector<aiVertexWeight> >::const_iterator it = dstBones.begin(); it != dstBones.end(); ++it) {
            if( it->size() > 0) {
                ++numRemainingBones;
            }
        }

        // create bone array and copy bone weights one by one
        dstMesh->mNumBones = static_cast<unsigned int>(numRemainingBones);
        dstMesh->mBones = new aiBone*[numRemainingBones];
        size_t boneCount = 0;
        for( size_t a = 0; a < numBones; ++a) {
            // omit bones without weights
            if( dstBones[a].empty() ) {
                continue;
            }

            // create bone with its weights
            aiBone* bone = new aiBone;
            bone->mName = ReadString(jointNamesAcc, jointNames, a);
            bone->mOffsetMatrix.a1 = ReadFloat(jointMatrixAcc, jointMatrices, a, 0);
            bone->mOffsetMatrix.a2 = ReadFloat(jointMatrixAcc, jointMatrices, a, 1);
            bone->mOffsetMatrix.a3 = ReadFloat(jointMatrixAcc, jointMatrices, a, 2);
            bone->mOffsetMatrix.a4 = ReadFloat(jointMatrixAcc, jointMatrices, a, 3);
            bone->mOffsetMatrix.b1 = ReadFloat(jointMatrixAcc, jointMatrices, a, 4);
            bone->mOffsetMatrix.b2 = ReadFloat(jointMatrixAcc, jointMatrices, a, 5);
            bone->mOffsetMatrix.b3 = ReadFloat(jointMatrixAcc, jointMatrices, a, 6);
            bone->mOffsetMatrix.b4 = ReadFloat(jointMatrixAcc, jointMatrices, a, 7);
            bone->mOffsetMatrix.c1 = ReadFloat(jointMatrixAcc, jointMatrices, a, 8);
            bone->mOffsetMatrix.c2 = ReadFloat(jointMatrixAcc, jointMatrices, a, 9);
            bone->mOffsetMatrix.c3 = ReadFloat(jointMatrixAcc, jointMatrices, a, 10);
            bone->mOffsetMatrix.c4 = ReadFloat(jointMatrixAcc, jointMatrices, a, 11);
            bone->mNumWeights = static_cast<unsigned int>(dstBones[a].size());
            bone->mWeights = new aiVertexWeight[bone->mNumWeights];
            std::copy(dstBones[a].begin(), dstBones[a].end(), bone->mWeights);

            // apply bind shape matrix to offset matrix
            aiMatrix4x4 bindShapeMatrix;
            bindShapeMatrix.a1 = pSrcController->mBindShapeMatrix[0];
            bindShapeMatrix.a2 = pSrcController->mBindShapeMatrix[1];
            bindShapeMatrix.a3 = pSrcController->mBindShapeMatrix[2];
            bindShapeMatrix.a4 = pSrcController->mBindShapeMatrix[3];
            bindShapeMatrix.b1 = pSrcController->mBindShapeMatrix[4];
            bindShapeMatrix.b2 = pSrcController->mBindShapeMatrix[5];
            bindShapeMatrix.b3 = pSrcController->mBindShapeMatrix[6];
            bindShapeMatrix.b4 = pSrcController->mBindShapeMatrix[7];
            bindShapeMatrix.c1 = pSrcController->mBindShapeMatrix[8];
            bindShapeMatrix.c2 = pSrcController->mBindShapeMatrix[9];
            bindShapeMatrix.c3 = pSrcController->mBindShapeMatrix[10];
            bindShapeMatrix.c4 = pSrcController->mBindShapeMatrix[11];
            bindShapeMatrix.d1 = pSrcController->mBindShapeMatrix[12];
            bindShapeMatrix.d2 = pSrcController->mBindShapeMatrix[13];
            bindShapeMatrix.d3 = pSrcController->mBindShapeMatrix[14];
            bindShapeMatrix.d4 = pSrcController->mBindShapeMatrix[15];
            bone->mOffsetMatrix *= bindShapeMatrix;

            // HACK: (thom) Some exporters address the bone nodes by SID, others address them by ID or even name.
            // Therefore I added a little name replacement here: I search for the bone's node by either name, ID or SID,
            // and replace the bone's name by the node's name so that the user can use the standard
            // find-by-name method to associate nodes with bones.
            const Collada::Node* bnode = FindNode( pParser.mRootNode, bone->mName.data);
            if( !bnode) {
                bnode = FindNodeBySID( pParser.mRootNode, bone->mName.data);
            }

            // assign the name that we would have assigned for the source node
            if( bnode) {
                bone->mName.Set( FindNameForNode( bnode));
            } else {
                ASSIMP_LOG_WARN_F( "ColladaLoader::CreateMesh(): could not find corresponding node for joint \"", bone->mName.data, "\"." );
            }

            // and insert bone
            dstMesh->mBones[boneCount++] = bone;
        }
    }

    return dstMesh.release();
}